

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

ll_node * ll_last(ll_node *node)

{
  ll_node *local_20;
  ll_node *cur_node;
  ll_node *node_local;
  
  local_20 = node;
  if (node == (ll_node *)0x0) {
    node_local = (ll_node *)0x0;
  }
  else {
    for (; local_20->next != (ll_node *)0x0; local_20 = local_20->next) {
    }
    node_local = local_20;
  }
  return node_local;
}

Assistant:

struct ll_node *ll_last(struct ll_node *node)
{
	if (node == NULL) {
		return NULL;
	}
	struct ll_node *cur_node = (struct ll_node *)node;
	while (cur_node->next != NULL) {
		cur_node = cur_node->next;
	}
	return cur_node;
}